

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O0

void __thiscall bloom_tests::bloom_match::test_method(bloom_match *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  string_view hex;
  string_view hex_00;
  string_view hex_01;
  string_view hex_02;
  Span<const_std::byte> sp;
  Span<const_unsigned_char> sp_00;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  Span<const_unsigned_char> vKey_01;
  Span<const_unsigned_char> vKey_02;
  Span<const_unsigned_char> vKey_03;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  Span<const_unsigned_char> vKey_06;
  Span<const_unsigned_char> vKey_07;
  bool bVar5;
  undefined1 uVar6;
  uchar *puVar7;
  byte *pbVar8;
  CBloomFilter *this_00;
  lazy_ostream *plVar9;
  transaction_identifier<false> *line_num;
  long in_FS_OFFSET;
  CTransaction *in_stack_ffffffffffffef78;
  undefined7 in_stack_ffffffffffffef80;
  undefined1 in_stack_ffffffffffffef87;
  undefined7 in_stack_ffffffffffffef88;
  undefined1 in_stack_ffffffffffffef8f;
  DataStream *in_stack_ffffffffffffef90;
  undefined7 in_stack_ffffffffffffef98;
  undefined1 in_stack_ffffffffffffef9f;
  const_string *in_stack_ffffffffffffefa0;
  const_string *pcVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffefa8;
  COutPoint *in_stack_ffffffffffffefb0;
  COutPoint *outpoint;
  undefined7 in_stack_ffffffffffffefb8;
  undefined1 in_stack_ffffffffffffefbf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffefc0;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  undefined8 in_stack_ffffffffffffefd0;
  uint nElements;
  CBloomFilter *in_stack_ffffffffffffefd8;
  CTransaction *in_stack_fffffffffffff008;
  CTransaction *tx_00;
  undefined7 in_stack_fffffffffffff010;
  undefined1 in_stack_fffffffffffff017;
  bloom_match *this_local;
  const_string local_df8;
  lazy_ostream local_de8 [2];
  assertion_result local_dc8 [3];
  const_string local_d80;
  lazy_ostream local_d70 [2];
  assertion_result local_d50 [3];
  const_string local_d08;
  lazy_ostream local_cf8 [2];
  assertion_result local_cd8 [3];
  const_string local_c90;
  lazy_ostream local_c80 [2];
  assertion_result local_c60 [3];
  const_string local_c18;
  lazy_ostream local_c08 [2];
  assertion_result local_be8 [3];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_string local_b70;
  lazy_ostream local_b60 [2];
  assertion_result local_b40 [3];
  const_string local_af8;
  lazy_ostream local_ae8 [2];
  assertion_result local_ac8 [3];
  const_string local_a80;
  lazy_ostream local_a70 [2];
  assertion_result local_a50 [2];
  const_string local_a18;
  lazy_ostream local_a08 [2];
  assertion_result local_9e8 [3];
  const_string local_9a0;
  lazy_ostream local_990 [2];
  assertion_result local_970 [3];
  const_string local_928;
  lazy_ostream local_918 [2];
  assertion_result local_8f8 [3];
  const_string local_8b0;
  lazy_ostream local_8a0 [2];
  assertion_result local_880 [3];
  const_string local_838;
  lazy_ostream local_828 [2];
  assertion_result local_808 [3];
  DataStream spendStream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  DataStream stream;
  COutPoint local_740 [2];
  CTransaction local_6f0 [2];
  CBloomFilter filter;
  COutPoint prevOutPoint;
  CTransaction spendingTx;
  uchar ch [260];
  CTransaction tx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<517UL>___1,_0,_0,_0,_1,_11,_38,_233,_183,_115,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,258ul>>
            ((Span<const_std::byte> *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<std::byte,_258UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  sp.m_size = (size_t)in_stack_ffffffffffffefa8;
  sp.m_data = (byte *)in_stack_ffffffffffffefa0;
  DataStream::DataStream(in_stack_ffffffffffffef90,sp);
  CTransaction::CTransaction<DataStream>(&tx,&::TX_WITH_WITNESS,&stream);
  memcpy(ch,&DAT_01bc7770,0x104);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffef78);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_ffffffffffffefc0,
             (uchar *)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uchar *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
             (allocator_type *)in_stack_ffffffffffffefb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffef78);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  sp_00.m_size = (size_t)in_stack_ffffffffffffefa8;
  sp_00.m_data = (uchar *)in_stack_ffffffffffffefa0;
  DataStream::DataStream
            ((DataStream *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),sp_00);
  CTransaction::CTransaction<DataStream>(&spendingTx,&::TX_WITH_WITNESS,&spendStream);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (uint256 *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             in_stack_ffffffffffffef78);
  vKey.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [41])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_808,local_828,&local_838,0x76,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[41],_const_char_(&)[41]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<65UL>___107,_255,_127,_205,_79,_133,_101,_239,_64,_109,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,32ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_32UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_00.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_00.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [61])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_880,local_8a0,&local_8b0,0x7b,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[61],_const_char_(&)[61]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[61],_const_char_(&)[61]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<145UL>___48,_69,_2,_32,_7,_10,_202,_68,_80,_108,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,72ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_72UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_01.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_01.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [49])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_8f8,local_918,&local_928,0x7f,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[49],_const_char_(&)[49]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<131UL>___4,_109,_17,_254,_229,_27,_14,_96,_102,_109,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,65ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_65UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_02.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_02.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_02);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [47])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_970,local_990,&local_9a0,0x83,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[47],_const_char_(&)[47]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[47],_const_char_(&)[47]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___4,_148,_63,_221,_80,_128,_83,_199,_80,_0,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_20UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_03.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_03.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_03);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [48])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_9e8,local_a08,&local_a18,0x87,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [38])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_a50,local_a70,&local_a80,0x88,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[38],_const_char_(&)[38]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___162,_102,_67,_109,_41,_101,_84,_118,_8,_185,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_20UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_04.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_04.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_04);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [48])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_ac8,local_ae8,&local_af8,0x8c,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (char *)in_stack_ffffffffffffef90);
  hex._M_len._7_1_ = in_stack_ffffffffffffef9f;
  hex._M_len._0_7_ = in_stack_ffffffffffffef98;
  hex._M_str = (char *)in_stack_ffffffffffffefa0;
  transaction_identifier<false>::FromHex(hex);
  std::optional<transaction_identifier<false>_>::value
            ((optional<transaction_identifier<false>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  COutPoint::COutPoint
            ((COutPoint *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (Txid *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             (uint32_t)((ulong)in_stack_ffffffffffffef78 >> 0x20));
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [43])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_b40,local_b60,&local_b70,0x90,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (char *)in_stack_ffffffffffffef90);
  hex_00._M_len._7_1_ = in_stack_ffffffffffffef9f;
  hex_00._M_len._0_7_ = in_stack_ffffffffffffef98;
  hex_00._M_str = (char *)in_stack_ffffffffffffefa0;
  transaction_identifier<false>::FromHex(hex_00);
  std::optional<transaction_identifier<false>_>::value
            ((optional<transaction_identifier<false>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  COutPoint::COutPoint
            ((COutPoint *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (Txid *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             (uint32_t)((ulong)in_stack_ffffffffffffef78 >> 0x20));
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_ffffffffffffef78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffefa8,(size_type)in_stack_ffffffffffffefa0,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_ffffffffffffef78);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffef78);
  pbVar8 = transaction_identifier<false>::begin
                     ((transaction_identifier<false> *)in_stack_ffffffffffffef78);
  uVar2 = *(undefined8 *)pbVar8;
  uVar3 = *(undefined8 *)(pbVar8 + 8);
  uVar4 = *(undefined8 *)(pbVar8 + 0x18);
  *(undefined8 *)(puVar7 + 0x10) = *(undefined8 *)(pbVar8 + 0x10);
  *(undefined8 *)(puVar7 + 0x18) = uVar4;
  *(undefined8 *)puVar7 = uVar2;
  *(undefined8 *)(puVar7 + 8) = uVar3;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffef78);
  *(uint32_t *)(puVar7 + 0x20) = prevOutPoint.n;
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_05.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_05.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_05);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [63])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_be8,local_c08,&local_c18,0x9a,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[63],_const_char_(&)[63]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  Span<const_unsigned_char>::Span<uint256>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (uint256 *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             in_stack_ffffffffffffef78);
  vKey_06.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_06.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_06);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),
               in_stack_fffffffffffff008);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [43])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_c60,local_c80,&local_c90,0x9e,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    in_stack_fffffffffffff017 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff017);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  tx_00 = local_6f0;
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  util::hex_literals::
  operator___hex_u8<util::hex_literals::detail::Hex<41UL>___0,_0,_0,_109,_41,_101,_84,_118,_8,_185,_______>
            ();
  Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
            ((Span<const_unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (array<unsigned_char,_20UL> *)
             CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),in_stack_ffffffffffffef78
            );
  vKey_07.m_size = (size_t)in_stack_ffffffffffffefa8;
  vKey_07.m_data = (uchar *)in_stack_ffffffffffffefa0;
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),vKey_07);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),tx_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [43])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_cd8,local_cf8,&local_d08,0xa2,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[43],_const_char_(&)[43]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    bVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar5);
  CBloomFilter::CBloomFilter
            (in_stack_ffffffffffffefd8,(uint)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
             (double)CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8),
             (uint)((ulong)in_stack_ffffffffffffefc0 >> 0x20),
             (uchar)((ulong)in_stack_ffffffffffffefc0 >> 0x18));
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (char *)in_stack_ffffffffffffef90);
  hex_01._M_len._7_1_ = in_stack_ffffffffffffef9f;
  hex_01._M_len._0_7_ = in_stack_ffffffffffffef98;
  hex_01._M_str = (char *)in_stack_ffffffffffffefa0;
  transaction_identifier<false>::FromHex(hex_01);
  this_00 = (CBloomFilter *)
            std::optional<transaction_identifier<false>_>::value
                      ((optional<transaction_identifier<false>_> *)
                       CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  COutPoint::COutPoint
            ((COutPoint *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (Txid *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             (uint32_t)((ulong)in_stack_ffffffffffffef78 >> 0x20));
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
             in_stack_ffffffffffffefb0);
  do {
    pcVar10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    nElements = (uint)((ulong)pcVar10 >> 0x20);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)in_stack_ffffffffffffefb0,(size_t)in_stack_ffffffffffffefa8,
               in_stack_ffffffffffffefa0);
    uVar6 = CBloomFilter::IsRelevantAndUpdate
                      ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010)
                       ,tx_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    plVar9 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [73])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_d50,local_d70,&local_d80,0xa6,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffefbf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffefbf);
  CBloomFilter::CBloomFilter
            (this_00,nElements,(double)CONCAT17(uVar6,in_stack_ffffffffffffefc8),
             (uint)((ulong)plVar9 >> 0x20),(uchar)((ulong)plVar9 >> 0x18));
  outpoint = local_740;
  CBloomFilter::operator=
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (CBloomFilter *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80));
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_ffffffffffffef9f,in_stack_ffffffffffffef98),
             (char *)in_stack_ffffffffffffef90);
  hex_02._M_len._7_1_ = in_stack_ffffffffffffef9f;
  hex_02._M_len._0_7_ = in_stack_ffffffffffffef98;
  hex_02._M_str = (char *)in_stack_ffffffffffffefa0;
  transaction_identifier<false>::FromHex(hex_02);
  line_num = std::optional<transaction_identifier<false>_>::value
                       ((optional<transaction_identifier<false>_> *)
                        CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  COutPoint::COutPoint
            ((COutPoint *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
             (Txid *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
             (uint32_t)((ulong)in_stack_ffffffffffffef78 >> 0x20));
  CBloomFilter::insert
            ((CBloomFilter *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),outpoint)
  ;
  do {
    pcVar10 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffefbf,in_stack_ffffffffffffefb8),
               (const_string *)outpoint,(size_t)line_num,pcVar10);
    CBloomFilter::IsRelevantAndUpdate
              ((CBloomFilter *)CONCAT17(in_stack_fffffffffffff017,in_stack_fffffffffffff010),tx_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (bool)in_stack_ffffffffffffef87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (char (*) [73])in_stack_ffffffffffffef78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88),
               (pointer)CONCAT17(in_stack_ffffffffffffef87,in_stack_ffffffffffffef80),
               (unsigned_long)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef78 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_dc8,local_de8,&local_df8,0xaa,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[73],_const_char_(&)[73]>
                        *)in_stack_ffffffffffffef78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffef78);
    in_stack_ffffffffffffef8f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffef8f);
  CBloomFilter::~CBloomFilter((CBloomFilter *)in_stack_ffffffffffffef78);
  CTransaction::~CTransaction(in_stack_ffffffffffffef78);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffef78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffef8f,in_stack_ffffffffffffef88));
  CTransaction::~CTransaction(in_stack_ffffffffffffef78);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffef78);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_match)
{
    // Random real transaction (b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b)
    DataStream stream{
        "01000000010b26e9b7735eb6aabdf358bab62f9816a21ba9ebdb719d5299e88607d722c190000000008b4830450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a0141046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339ffffffff021bff3d11000000001976a91404943fdd508053c75000106d3bc6e2754dbcff1988ac2f15de00000000001976a914a266436d2965547608b9e15d9032a7b9d64fa43188ac00000000"_hex,
    };
    CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

    // and one which spends it (e2769b09e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436)
    unsigned char ch[] = {0x01, 0x00, 0x00, 0x00, 0x01, 0x6b, 0xff, 0x7f, 0xcd, 0x4f, 0x85, 0x65, 0xef, 0x40, 0x6d, 0xd5, 0xd6, 0x3d, 0x4f, 0xf9, 0x4f, 0x31, 0x8f, 0xe8, 0x20, 0x27, 0xfd, 0x4d, 0xc4, 0x51, 0xb0, 0x44, 0x74, 0x01, 0x9f, 0x74, 0xb4, 0x00, 0x00, 0x00, 0x00, 0x8c, 0x49, 0x30, 0x46, 0x02, 0x21, 0x00, 0xda, 0x0d, 0xc6, 0xae, 0xce, 0xfe, 0x1e, 0x06, 0xef, 0xdf, 0x05, 0x77, 0x37, 0x57, 0xde, 0xb1, 0x68, 0x82, 0x09, 0x30, 0xe3, 0xb0, 0xd0, 0x3f, 0x46, 0xf5, 0xfc, 0xf1, 0x50, 0xbf, 0x99, 0x0c, 0x02, 0x21, 0x00, 0xd2, 0x5b, 0x5c, 0x87, 0x04, 0x00, 0x76, 0xe4, 0xf2, 0x53, 0xf8, 0x26, 0x2e, 0x76, 0x3e, 0x2d, 0xd5, 0x1e, 0x7f, 0xf0, 0xbe, 0x15, 0x77, 0x27, 0xc4, 0xbc, 0x42, 0x80, 0x7f, 0x17, 0xbd, 0x39, 0x01, 0x41, 0x04, 0xe6, 0xc2, 0x6e, 0xf6, 0x7d, 0xc6, 0x10, 0xd2, 0xcd, 0x19, 0x24, 0x84, 0x78, 0x9a, 0x6c, 0xf9, 0xae, 0xa9, 0x93, 0x0b, 0x94, 0x4b, 0x7e, 0x2d, 0xb5, 0x34, 0x2b, 0x9d, 0x9e, 0x5b, 0x9f, 0xf7, 0x9a, 0xff, 0x9a, 0x2e, 0xe1, 0x97, 0x8d, 0xd7, 0xfd, 0x01, 0xdf, 0xc5, 0x22, 0xee, 0x02, 0x28, 0x3d, 0x3b, 0x06, 0xa9, 0xd0, 0x3a, 0xcf, 0x80, 0x96, 0x96, 0x8d, 0x7d, 0xbb, 0x0f, 0x91, 0x78, 0xff, 0xff, 0xff, 0xff, 0x02, 0x8b, 0xa7, 0x94, 0x0e, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xba, 0xde, 0xec, 0xfd, 0xef, 0x05, 0x07, 0x24, 0x7f, 0xc8, 0xf7, 0x42, 0x41, 0xd7, 0x3b, 0xc0, 0x39, 0x97, 0x2d, 0x7b, 0x88, 0xac, 0x40, 0x94, 0xa8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x19, 0x76, 0xa9, 0x14, 0xc1, 0x09, 0x32, 0x48, 0x3f, 0xec, 0x93, 0xed, 0x51, 0xf5, 0xfe, 0x95, 0xe7, 0x25, 0x59, 0xf2, 0xcc, 0x70, 0x43, 0xf9, 0x88, 0xac, 0x00, 0x00, 0x00, 0x00, 0x00};
    std::vector<unsigned char> vch(ch, ch + sizeof(ch) -1);
    DataStream spendStream{vch};
    CTransaction spendingTx(deserialize, TX_WITH_WITNESS, spendStream);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"b4749f017444b051c44dfd2720e88f314ff94f3dd6d56d40ef65854fcd7fff6b"});
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // byte-reversed tx hash
    filter.insert("6bff7fcd4f8565ef406dd5d63d4ff94f318fe82027fd4dc451b04474019f74b4"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("30450220070aca44506c5cef3a16ed519d7c3c39f8aab192c4e1c90d065f37b8a4af6141022100a8e160b856c2d43d27d8fba71e5aef6405b8643ac4cb7cb3c462aced7f14711a01"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input signature");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("046d11fee51b0e60666d5049a9101a72741df480b96ee26488a4d3466b95c9a40ac5eeef87e10a5cd336c19a84565f80fa6c547957b7700ff4dfbdefe76036c339"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match input pub key");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("04943fdd508053c75000106d3bc6e2754dbcff19"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(spendingTx), "Simple Bloom filter didn't add output");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("a266436d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match output address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    COutPoint prevOutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0);
    {
        std::vector<unsigned char> data(32 + sizeof(unsigned int));
        memcpy(data.data(), prevOutPoint.hash.begin(), 32);
        memcpy(data.data()+32, &prevOutPoint.n, sizeof(unsigned int));
        filter.insert(data);
    }
    BOOST_CHECK_MESSAGE(filter.IsRelevantAndUpdate(tx), "Simple Bloom filter didn't match manually serialized COutPoint");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(uint256{"00000009e784f32f62ef849763d4f45b98e07ba658647343b915ff832b110436"});
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random tx hash");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert("0000006d2965547608b9e15d9032a7b9d64fa431"_hex_u8);
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched random address");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("90c122d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 1));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");

    filter = CBloomFilter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    filter.insert(COutPoint(Txid::FromHex("000000d70786e899529d71dbeba91ba216982fb6ba58f3bdaab65e73b7e9260b").value(), 0));
    BOOST_CHECK_MESSAGE(!filter.IsRelevantAndUpdate(tx), "Simple Bloom filter matched COutPoint for an output we didn't care about");
}